

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetElementI_UInt32
              (Var instance,uint32 index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  Var pvVar6;
  double value;
  
  if ((int)index < 0) {
    value = (double)index;
    uVar3 = NumberUtilities::ToSpecial(value);
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      uVar4 = NumberUtilities::ToSpecial(value);
      if (uVar4 != 0xfff8000000000000) {
        uVar4 = NumberUtilities::ToSpecial(value);
        if (uVar4 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
    }
    pvVar6 = (Var)(uVar3 ^ 0xfffc000000000000);
  }
  else {
    pvVar6 = (Var)((ulong)index | 0x1000000000000);
  }
  pvVar6 = OP_GetElementI_JIT(instance,pvVar6,scriptContext);
  return pvVar6;
}

Assistant:

Var JavascriptOperators::OP_GetElementI_UInt32(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetElementI_UInt32);
#if FLOATVAR
        return OP_GetElementI_JIT(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetElementI_JIT(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_GetElementI_UInt32);
    }